

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

bool QTestResult::compare
               (bool success,char *failureMsg,char *val1,char *val2,char *actual,char *expected,
               char *file,int line)

{
  long lVar1;
  bool bVar2;
  void *in_RCX;
  void *in_RDX;
  char *in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  bool result;
  char *in_stack_00000f90;
  int in_stack_00000f98;
  bool in_stack_ffffffffffffff4f;
  char *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  char **in_stack_ffffffffffffff60;
  char **in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = compareHelper<char_const*,char_const*>
                    (SUB81((ulong)in_R9 >> 0x30,0),in_R8,in_stack_ffffffffffffff68,
                     in_stack_ffffffffffffff60,
                     (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff50,in_stack_00000f90,in_stack_00000f98,
                     in_stack_ffffffffffffff4f);
  if (in_RDX != (void *)0x0) {
    operator_delete__(in_RDX);
  }
  if (in_RCX != (void *)0x0) {
    operator_delete__(in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTestResult::compare(bool success, const char *failureMsg,
                          char *val1, char *val2,
                          const char *actual, const char *expected,
                          const char *file, int line)
{
    const bool result = compareHelper(success, failureMsg,
                                      val1 != nullptr ? val1 : "<null>",
                                      val2 != nullptr ? val2 : "<null>",
                                      actual, expected, file, line,
                                      val1 != nullptr && val2 != nullptr);

    // Our caller got these from QTest::toString()
    delete [] val1;
    delete [] val2;

    return result;
}